

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

int writeMPS(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
            vector<int,_std::allocator<int>_> *Astart,vector<int,_std::allocator<int>_> *Aindex,
            vector<double,_std::allocator<double>_> *Avalue,
            vector<double,_std::allocator<double>_> *colCost,
            vector<double,_std::allocator<double>_> *colLower,
            vector<double,_std::allocator<double>_> *colUpper,
            vector<double,_std::allocator<double>_> *rowLower,
            vector<double,_std::allocator<double>_> *rowUpper,
            vector<int,_std::allocator<int>_> *integerColumn)

{
  double dVar1;
  double val;
  bool b;
  bool bVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *this;
  char *pcVar6;
  char *pcVar7;
  int *in_RDX;
  int *in_RSI;
  char *in_RDI;
  vector<int,_std::allocator<int>_> *in_R9;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<int,_std::allocator<int>_> *in_stack_00000040;
  double ub;
  double lb;
  int c_n_2;
  double v_3;
  int r_n_6;
  double v_2;
  int r_n_5;
  int r_n_4;
  double v_1;
  int el_n;
  double v;
  int c_n_1;
  int nIntegerMk;
  bool integerFg;
  int r_n_3;
  int c_n;
  int r_n_2;
  int r_n_1;
  int r_n;
  bool have_bounds;
  bool have_ranges;
  bool have_rhs;
  vector<double,_std::allocator<double>_> ranges;
  vector<double,_std::allocator<double>_> rhs;
  vector<int,_std::allocator<int>_> r_ty;
  FILE *file;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int iVar8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffea8;
  value_type vVar9;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  int local_10c;
  int local_fc;
  int local_f0;
  int local_dc;
  int local_d0;
  uint local_cc;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  bool local_89;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  FILE *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  int *local_20;
  int *local_18;
  char *local_10;
  int local_4;
  
  local_38 = in_R9;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  printf("writeMPS: Trying to open file %s\n",in_RDI);
  local_40 = fopen(local_10,"w");
  if (local_40 == (FILE *)0x0) {
    printf("writeMPS: Not opened file OK\n");
    local_4 = 1;
  }
  else {
    printf("writeMPS: Opened file  OK\n");
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c8982);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x1c898f);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x1c899c);
    local_89 = false;
    bVar3 = false;
    b = false;
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_fffffffffffffe90,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (value_type_conflict1 *)0x1c89f7);
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_fffffffffffffe90,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (value_type_conflict1 *)0x1c8a25);
    for (local_b4 = 0; local_b4 < *local_18; local_b4 = local_b4 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000030,(long)local_b4);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000038,(long)local_b4);
      if ((dVar1 != *pvVar4) || (NAN(dVar1) || NAN(*pvVar4))) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000038,(long)local_b4);
        bVar2 = hsol_isInfinity(*pvVar4);
        if (bVar2) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_stack_00000030,(long)local_b4);
          bVar2 = hsol_isInfinity(-*pvVar4);
          if (bVar2) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_b4);
            *pvVar5 = 0;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_70,(long)local_b4);
            *pvVar4 = 0.0;
          }
          else {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_b4);
            *pvVar5 = 3;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_stack_00000030,(long)local_b4);
            vVar9 = *pvVar4;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_70,(long)local_b4);
            *pvVar4 = vVar9;
          }
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_b4);
          *pvVar5 = 2;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_stack_00000038,(long)local_b4);
          vVar9 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_70,(long)local_b4);
          *pvVar4 = vVar9;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_stack_00000030,(long)local_b4);
          bVar2 = hsol_isInfinity(-*pvVar4);
          if (!bVar2) {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_stack_00000038,(long)local_b4);
            vVar9 = *pvVar4;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_stack_00000030,(long)local_b4);
            dVar1 = *pvVar4;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_88,(long)local_b4);
            *pvVar4 = vVar9 - dVar1;
          }
        }
      }
      else {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_b4);
        *pvVar5 = 1;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000030,(long)local_b4);
        vVar9 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,(long)local_b4);
        *pvVar4 = vVar9;
      }
    }
    for (local_b8 = 0; local_b8 < *local_18; local_b8 = local_b8 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,(long)local_b8);
      if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
        local_89 = true;
        break;
      }
    }
    for (local_bc = 0; local_bc < *local_18; local_bc = local_bc + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_88,(long)local_bc);
      if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
        bVar3 = true;
        break;
      }
    }
    for (local_c0 = 0; local_c0 < *local_20; local_c0 = local_c0 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000020,(long)local_c0);
      if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
        b = true;
        break;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000028,(long)local_c0);
      bVar2 = hsol_isInfinity(*pvVar4);
      if (!bVar2) {
        b = true;
        break;
      }
    }
    this = (vector<double,_std::allocator<double>_> *)BoolToString(local_89);
    pcVar6 = BoolToString(bVar3);
    pcVar7 = BoolToString(b);
    printf("Model: RHS =     %s\n       RANGES =  %s\n       BOUNDS =  %s\n",this,pcVar6,pcVar7);
    fprintf(local_40,"NAME\n");
    fprintf(local_40,"ROWS\n");
    fprintf(local_40," N  COST\n");
    for (local_c4 = 0; local_c4 < *local_18; local_c4 = local_c4 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_c4);
      if (*pvVar5 == 1) {
        fprintf(local_40," E  R%-7d\n",(ulong)(local_c4 + 1));
      }
      else {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_c4);
        if (*pvVar5 == 3) {
          fprintf(local_40," G  R%-7d\n",(ulong)(local_c4 + 1));
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_c4);
          if (*pvVar5 == 2) {
            fprintf(local_40," L  R%-7d\n",(ulong)(local_c4 + 1));
          }
          else {
            fprintf(local_40," N  R%-7d\n",(ulong)(local_c4 + 1));
          }
        }
      }
    }
    bVar2 = false;
    local_cc = 0;
    fprintf(local_40,"COLUMNS\n");
    for (local_d0 = 0; local_d0 < *local_20; local_d0 = local_d0 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000040,(long)local_d0);
      if ((*pvVar5 == 0) || (bVar2)) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000040,(long)local_d0);
        if ((*pvVar5 == 0) && (bVar2)) {
          fprintf(local_40,"    MARK%04d  \'MARKER\'                 \'INTEND\'\n",(ulong)local_cc);
          local_cc = local_cc + 1;
          bVar2 = false;
        }
      }
      else {
        fprintf(local_40,"    MARK%04d  \'MARKER\'                 \'INTORG\'\n",(ulong)local_cc);
        local_cc = local_cc + 1;
        bVar2 = true;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000018,(long)local_d0);
      if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000018,(long)local_d0);
        fprintf(local_40,"    C%-7d  COST      %12g\n",*pvVar4,(ulong)(local_d0 + 1));
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_d0);
      local_dc = *pvVar5;
      while (iVar8 = local_dc,
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_38,(long)(local_d0 + 1)), iVar8 < *pvVar5) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000010,(long)local_dc);
        vVar9 = *pvVar4;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000008,(long)local_dc);
        fprintf(local_40,"    C%-7d  R%-7d  %12g\n",vVar9,(ulong)(local_d0 + 1),(ulong)(*pvVar5 + 1)
               );
        local_dc = local_dc + 1;
      }
    }
    fprintf(local_40,"RHS\n");
    for (local_f0 = 0; local_f0 < *local_18; local_f0 = local_f0 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,(long)local_f0);
      fprintf(local_40,"    RHS_V     R%-7d  %12g\n",*pvVar4,(ulong)(local_f0 + 1));
    }
    if (bVar3 != false) {
      fprintf(local_40,"RANGES\n");
      for (local_fc = 0; local_fc < *local_18; local_fc = local_fc + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_88,(long)local_fc);
        dVar1 = *pvVar4;
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          fprintf(local_40,"    RANGE     R%-7d  %12g\n",dVar1,(ulong)(local_fc + 1));
        }
      }
    }
    if (b != false) {
      fprintf(local_40,"BOUNDS\n");
      for (local_10c = 0; local_10c < *local_20; local_10c = local_10c + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000020,(long)local_10c);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000028,(long)local_10c);
        val = *pvVar4;
        if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) {
          bVar3 = hsol_isInfinity(val);
          if (!bVar3) {
            fprintf(local_40," UP BOUND     C%-7d  %12g\n",val,(ulong)(local_10c + 1));
          }
          bVar3 = hsol_isInfinity(-dVar1);
          if (bVar3) {
            fprintf(local_40," MI BOUND     C%-7d\n",(ulong)(local_10c + 1));
          }
          else if ((dVar1 != 0.0) || (NAN(dVar1))) {
            fprintf(local_40," LO BOUND     C%-7d  %12g\n",dVar1,(ulong)(local_10c + 1));
          }
        }
        else {
          fprintf(local_40," FX BOUND     C%-7d  %12g\n",dVar1,(ulong)(local_10c + 1));
        }
      }
    }
    fprintf(local_40,"ENDATA\n");
    fclose(local_40);
    local_4 = 0;
    std::vector<double,_std::allocator<double>_>::~vector(this);
    std::vector<double,_std::allocator<double>_>::~vector(this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  }
  return local_4;
}

Assistant:

int writeMPS(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
	     vector<int>& Astart, vector<int>& Aindex, vector<double>& Avalue,
	     vector<double>& colCost, vector<double>& colLower, vector<double>& colUpper,
	     vector<double>& rowLower, vector<double>& rowUpper,
	     vector<int>& integerColumn) {

#ifdef JAJH_dev
    printf("writeMPS: Trying to open file %s\n", filename);
#endif
    FILE *file = fopen(filename, "w");
    if (file == 0) {
#ifdef JAJH_dev
      printf("writeMPS: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("writeMPS: Opened file  OK\n");
#endif
    vector<int> r_ty;
    vector<double> rhs, ranges;
    bool have_rhs = false;
    bool have_ranges = false;
    bool have_bounds = false;
    r_ty.resize(numRow);
    rhs.assign(numRow, 0);
    ranges.assign(numRow, 0);
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (rowLower[r_n] == rowUpper[r_n]) {
	//Equality constraint - Type E - range = 0
	r_ty[r_n] = MPS_ROW_TY_E;
	rhs[r_n] = rowLower[r_n];
      } else if (!hsol_isInfinity(rowUpper[r_n])) {
	//Upper bounded constraint - Type L
	r_ty[r_n] = MPS_ROW_TY_L;
	rhs[r_n] = rowUpper[r_n];
	if (!hsol_isInfinity(-rowLower[r_n])) {
	  //Boxed constraint - range = u-l
	  ranges[r_n] = rowUpper[r_n]-rowLower[r_n];
	}
      } else if (!hsol_isInfinity(-rowLower[r_n])) {
	//Lower bounded constraint - Type G
	r_ty[r_n] = MPS_ROW_TY_G;
	rhs[r_n] = rowLower[r_n];
      } else {
	//Free constraint - Type N
	r_ty[r_n] = MPS_ROW_TY_N;
	rhs[r_n] = 0;
      }
    }
    
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (rhs[r_n]) {
	have_rhs = true;
	break;
      }
    }
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (ranges[r_n]) {
	have_ranges = true;
	break;
      }
    }
    for (int c_n = 0; c_n < numCol; c_n++) {
      if (colLower[c_n]) {
	have_bounds = true;
	break;
      }
      if (!hsol_isInfinity(colUpper[c_n])) {
	have_bounds = true;
	break;
      }
    }
    printf("Model: RHS =     %s\n       RANGES =  %s\n       BOUNDS =  %s\n",
	   BoolToString(have_rhs), BoolToString(have_ranges), BoolToString(have_bounds));
    
    //Field:    1           2          3         4         5         6
    //Columns:  2-3        5-12      15-22     25-36     40-47     50-61
    //         1         2         3         4         5         6
    //1234567890123456789012345678901234567890123456789012345678901
    //x11x22222222xx33333333xx444444444444xxx55555555xx666666666666
    fprintf(file, "NAME\n");
    fprintf(file, "ROWS\n");
    fprintf(file, " N  COST\n");	
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (r_ty[r_n] == MPS_ROW_TY_E) {
	fprintf(file, " E  R%-7d\n", r_n+1);	
      } else if (r_ty[r_n] == MPS_ROW_TY_G) {
	fprintf(file, " G  R%-7d\n", r_n+1);	
      } else if (r_ty[r_n] == MPS_ROW_TY_L) {
	fprintf(file, " L  R%-7d\n", r_n+1);	
      } else {
	fprintf(file, " N  R%-7d\n", r_n+1);	
      }
    }
    bool integerFg = false;
    int nIntegerMk = 0;
    fprintf(file, "COLUMNS\n");
    for (int c_n = 0; c_n < numCol; c_n++) {
      if (integerColumn[c_n] && !integerFg) {
	//Start an integer section
	fprintf(file, "    MARK%04d  'MARKER'                 'INTORG'\n", nIntegerMk);
	nIntegerMk++;
	integerFg = true;
      } else if (!integerColumn[c_n] && integerFg) {
	//End an integer section
	fprintf(file, "    MARK%04d  'MARKER'                 'INTEND'\n", nIntegerMk);
	nIntegerMk++;
	integerFg = false;
      }
      if (colCost[c_n] != 0) {
	double v = colCost[c_n];
	fprintf(file, "    C%-7d  COST      %12g\n", c_n+1, v);	
      }
      for (int el_n = Astart[c_n]; el_n<Astart[c_n+1]; el_n++) {
	double v = Avalue[el_n];
	int r_n = Aindex[el_n];
	fprintf(file, "    C%-7d  R%-7d  %12g\n", c_n+1, r_n+1, v);	
      }
    }
    have_rhs = true;
    if (have_rhs) {
      fprintf(file, "RHS\n");
      for (int r_n = 0; r_n < numRow; r_n++) {
	double v = rhs[r_n];
	//	if (v !=0)
	  fprintf(file, "    RHS_V     R%-7d  %12g\n", r_n+1, v);
      }
    }
    if (have_ranges) {
      fprintf(file, "RANGES\n");
      for (int r_n = 0; r_n < numRow; r_n++) {
	double v = ranges[r_n];
	if (v !=0) fprintf(file, "    RANGE     R%-7d  %12g\n", r_n+1, v);
      }
    }
    if (have_bounds) {
      fprintf(file, "BOUNDS\n");
      for (int c_n = 0; c_n < numCol; c_n++) {
	double lb = colLower[c_n];
	double ub = colUpper[c_n];
	if (lb == ub) {
	  fprintf(file, " FX BOUND     C%-7d  %12g\n", c_n+1, lb);
	} else {
	  if (!hsol_isInfinity(ub)) {
	    //Upper bounded variable
	    fprintf(file, " UP BOUND     C%-7d  %12g\n", c_n+1, ub);
	  }
	  if (!hsol_isInfinity(-lb)) {
	      //Lower bounded variable - default is 0
	      if (lb) {
		fprintf(file, " LO BOUND     C%-7d  %12g\n", c_n+1, lb);
	      }
	    } else {
	      //Infinite lower bound
	      fprintf(file, " MI BOUND     C%-7d\n", c_n+1);
	  }
	}
      }
    }
    fprintf(file, "ENDATA\n");
    fclose(file);
    return 0;
}